

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_any.hpp
# Opt level: O1

void __thiscall iutest::any::any(any *this,char *rhs)

{
  placeholder *ppVar1;
  allocator<char> local_39;
  long *local_38;
  long local_30;
  long local_28 [2];
  
  ppVar1 = (placeholder *)operator_new(0x28);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,rhs,&local_39);
  ppVar1->_vptr_placeholder = (_func_int **)&PTR__holder_001881e0;
  ppVar1[1]._vptr_placeholder = (_func_int **)(ppVar1 + 3);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(ppVar1 + 1),local_38,local_30 + (long)local_38);
  if (local_38 != local_28) {
    operator_delete(local_38,local_28[0] + 1);
  }
  this->content = ppVar1;
  return;
}

Assistant:

any(const char rhs[]) : content(new holder< ::std::string >(::std::string(rhs)) ) {}